

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

void __thiscall Fl_Input_Choice_Type::ideal_size(Fl_Input_Choice_Type *this,int *w,int *h)

{
  Fl_Input_Choice *this_00;
  Fl_Font face;
  Fl_Fontsize FVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  int ww;
  Fl_Input_Choice *myo;
  int *h_local;
  int *w_local;
  Fl_Input_Choice_Type *this_local;
  
  this_00 = (Fl_Input_Choice *)(this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  face = Fl_Input_Choice::textfont(this_00);
  FVar1 = Fl_Input_Choice::textsize(this_00);
  fl_font(face,FVar1);
  iVar2 = fl_height();
  FVar1 = Fl_Input_Choice::textsize(this_00);
  *h = iVar2 + FVar1 + -6;
  iVar2 = Fl_Widget::w((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  FVar3 = Fl_Widget::box((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  iVar4 = Fl::box_dw(FVar3);
  *w = (iVar2 + -0x14) - iVar4;
  dVar6 = fl_width(0x6d);
  iVar4 = (int)dVar6;
  iVar2 = *w;
  FVar3 = Fl_Widget::box((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  iVar5 = Fl::box_dw(FVar3);
  *w = ((iVar2 + iVar4 + -1) / iVar4) * iVar4 + 0x14 + iVar5;
  if (*h < 0xf) {
    *h = 0xf;
  }
  if (*w < *h + 0xf) {
    *w = *h + 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Input_Choice *myo = (Fl_Input_Choice *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() - 6;
    w = o->w() - 20 - Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + 20 + Fl::box_dw(o->box());
    if (h < 15) h = 15;
    if (w < (15 + h)) w = 15 + h;
  }